

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionCode.cpp
# Opt level: O2

void Hpipe::InstructionCode::write_code
               (StreamSepMaker *ss,CppEmitter *cpp_emitter,string *str,string *repl)

{
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  size_type pos;
  string local_230 [8];
  long local_228;
  string local_210;
  ostringstream val;
  StreamSep local_78;
  
  p_Var1 = &(cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var3 = (cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    sVar2 = 0;
    while( true ) {
      sVar2 = find_var_in_code(str,(string *)(p_Var3 + 1),sVar2);
      if (sVar2 == 0xffffffffffffffff) break;
      std::__cxx11::string::replace((ulong)str,sVar2,(char *)0x0);
      std::__cxx11::string::_M_assign((string *)str);
      sVar2 = (long)&(p_Var3[1]._M_parent)->_M_parent + sVar2 + 3;
    }
  }
  sVar2 = 0;
  while( true ) {
    std::__cxx11::string::string((string *)&val,"RETURN_STOP_CONT",(allocator *)local_230);
    sVar2 = find_var_in_code(str,(string *)&val,sVar2);
    std::__cxx11::string::~string((string *)&val);
    if (sVar2 == 0xffffffffffffffff) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&val);
    poVar4 = std::operator<<((ostream *)&val,"HPIPE_DATA.inp_cont = &&c_");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"; return RET_STOP_CONT; c_");
    cpp_emitter->nb_cont_label = cpp_emitter->nb_cont_label + 1;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,":;");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::replace((ulong)str,sVar2,(string *)0x10);
    std::__cxx11::string::_M_assign((string *)str);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::stringbuf::str();
    sVar2 = sVar2 + local_228;
    std::__cxx11::string::~string(local_230);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&val);
  }
  if (repl->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_210,(string *)str);
    CppEmitter::repl_data((string *)&val,cpp_emitter,&local_210,repl);
    std::__cxx11::string::operator=((string *)str,(string *)&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&local_210);
  }
  for (p_Var5 = (cpp_emitter->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    sVar2 = 0;
    while( true ) {
      std::__cxx11::string::string((string *)&val,"__data",(allocator *)local_230);
      sVar2 = find_var_in_code(str,(string *)&val,sVar2);
      std::__cxx11::string::~string((string *)&val);
      if (sVar2 == 0xffffffffffffffff) break;
      std::__cxx11::string::replace((ulong)str,sVar2,(char *)0x2,0x1760d4);
      std::__cxx11::string::_M_assign((string *)str);
      sVar2 = sVar2 + 4;
    }
  }
  StreamSepMaker::operator<<(&local_78,ss,str);
  StreamSep::~StreamSep(&local_78);
  return;
}

Assistant:

void InstructionCode::write_code( StreamSepMaker &ss, CppEmitter *cpp_emitter, std::string str, const std::string &repl ) {
    // variables
    for( auto &p : cpp_emitter->variables ) {
        for( std::string::size_type pos = 0; ; ) {
            pos = find_var_in_code( str, p.first, pos );
            if ( pos == std::string::npos )
                break;
            str = str.replace( pos, 0, "HPIPE_DATA." );
            pos += 11 + p.first.size();
        }
    }

    // RETURN_CONT
    for( std::string::size_type pos = 0; ; ) {
        pos = find_var_in_code( str, "RETURN_STOP_CONT", pos );
        if ( pos == std::string::npos )
            break;
        // ++cpp_emitter->nb_cont_label;
        std::ostringstream val;
        val << "HPIPE_DATA.inp_cont = &&c_" << cpp_emitter->nb_cont_label << "; return RET_STOP_CONT; c_" << ++cpp_emitter->nb_cont_label << ":;";
        str = str.replace( pos, 16, val.str() );
        pos += val.str().size();
    }

    // data -> *( save + x ), ...
    if ( repl.size() )
        str = cpp_emitter->repl_data( str, repl );

    // __data -> data
    for( auto &p : cpp_emitter->variables ) {
        for( std::string::size_type pos = 0; ; ) {
            pos = find_var_in_code( str, "__data", pos );
            if ( pos == std::string::npos )
                break;
            str = str.replace( pos, 2, "", 0 );
            pos += 4;
        }
    }

    ss << str;
}